

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext *ctx,ExprMemberAccess *node)

{
  bool bVar1;
  LLVMValueRef pLVar2;
  TypeRef *pTVar3;
  TypeStruct *node_00;
  LLVMTypeRef pLVar4;
  LLVMValueRef local_58;
  LLVMValueRef indices [2];
  MemberHandle *local_40;
  MemberHandle *curr;
  uint currMember;
  uint memberIndex;
  TypeStruct *typeStruct;
  TypeRef *typeRef;
  LLVMValueRef value;
  ExprMemberAccess *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar2 = CompileLlvm(ctx,node->value);
  pTVar3 = getType<TypeRef>(node->value->type);
  node_00 = getType<TypeStruct>(pTVar3->subType);
  curr._4_4_ = 0xffffffff;
  bVar1 = isType<TypeUnsizedArray>(&node_00->super_TypeBase);
  curr._0_4_ = (uint)bVar1;
  local_40 = (node_00->members).head;
  do {
    if (local_40 == (MemberHandle *)0x0) {
LAB_001e25a9:
      if (curr._4_4_ != 0xffffffff) {
        pLVar4 = LLVMInt32TypeInContext(ctx->context);
        local_58 = LLVMConstInt(pLVar4,0,true);
        pLVar4 = LLVMInt32TypeInContext(ctx->context);
        indices[0] = LLVMConstInt(pLVar4,(ulong)curr._4_4_,true);
        pLVar2 = LLVMBuildGEP(ctx->builder,pLVar2,&local_58,2,"");
        pLVar2 = CheckType(ctx,&node->super_ExprBase,pLVar2);
        return pLVar2;
      }
      __assert_fail("memberIndex != ~0u",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x589,
                    "LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext &, ExprMemberAccess *)"
                   );
    }
    if (local_40->variable == node->member->variable) {
      curr._4_4_ = (uint)curr;
      goto LAB_001e25a9;
    }
    curr._0_4_ = (uint)curr + 1;
    local_40 = local_40->next;
  } while( true );
}

Assistant:

LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext &ctx, ExprMemberAccess *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	TypeRef *typeRef = getType<TypeRef>(node->value->type);
	TypeStruct *typeStruct = getType<TypeStruct>(typeRef->subType);

	unsigned memberIndex = ~0u;

	unsigned currMember = 0;

	// Unsized array types have a hidden member (pointer) at index 0
	if(isType<TypeUnsizedArray>(typeStruct))
		currMember++;

	for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
	{
		if(curr->variable == node->member->variable)
		{
			memberIndex = currMember;
			break;
		}

		currMember++;
	}

	assert(memberIndex != ~0u);

	LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), memberIndex, true) };

	return CheckType(ctx, node, LLVMBuildGEP(ctx.builder, value, indices, 2, ""));
}